

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_new_token_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_new_token_frame_t *in_RSI;
  long *in_RDI;
  int ret;
  quicly_new_token_frame_t frame;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = quicly_decode_new_token_frame
                    ((uint8_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint8_t *)in_RDI,in_RSI);
  if (iVar1 == 0) {
    if (*(long *)(*in_RDI + 0xd8) == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (*(code *)**(undefined8 **)(*in_RDI + 0xd8))
                        (*(undefined8 *)(*in_RDI + 0xd8),in_RDI,local_28,local_20);
    }
  }
  return iVar1;
}

Assistant:

static int handle_new_token_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_new_token_frame_t frame;
    int ret;

    if ((ret = quicly_decode_new_token_frame(&state->src, state->end, &frame)) != 0)
        return ret;
    QUICLY_PROBE(NEW_TOKEN_RECEIVE, conn, conn->stash.now, frame.token.base, frame.token.len);
    if (conn->super.ctx->save_resumption_token == NULL)
        return 0;
    return conn->super.ctx->save_resumption_token->cb(conn->super.ctx->save_resumption_token, conn, frame.token);
}